

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O0

uint zvgReadSpeedInfo(uint *speeds)

{
  uint uVar1;
  uint local_24;
  uint err;
  uint ecpErr;
  uint readLen;
  uint *speeds_local;
  
  local_24 = 0;
  _ecpErr = speeds;
  if ((ZvgIO.ecpFlags & 1) == 0) {
    local_24 = zvgSetEcpMode();
  }
  if (local_24 == 0) {
    zvgEcpPutc(0xee);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    speeds_local._4_4_ = zvgIsDataAvail(1000);
    if ((speeds_local._4_4_ == 0) &&
       (local_24 = zvgGetMem(ZvgIO.mBfr,4,&err), speeds_local._4_4_ = local_24, local_24 == 0)) {
      if (err != 4) {
        local_24 = 0x14;
      }
      *_ecpErr = (uint)ZvgIO.mBfr[0];
      _ecpErr[1] = (uint)ZvgIO.mBfr[1];
      _ecpErr[2] = (uint)ZvgIO.mBfr[2];
      _ecpErr[3] = (uint)ZvgIO.mBfr[3];
      uVar1 = zvgSetEcpMode();
      if (uVar1 != 0) {
        local_24 = uVar1;
      }
      speeds_local._4_4_ = local_24;
    }
  }
  else {
    speeds_local._4_4_ = local_24;
  }
  return speeds_local._4_4_;
}

Assistant:

uint zvgReadSpeedInfo( ZvgSpeeds_a speeds)
{
	uint	readLen, ecpErr, err=0;

	if (!(ZvgIO.ecpFlags & ECPF_ECP))
		err = zvgSetEcpMode();				// if not ECP mode, set to ECP mode

	if (err)
		return (err);							// return on any errors

	// request speed table information

	// The ZVG has a 9 byte look ahead buffer.  Until at least 9 bytes are
	// in it's command buffer, nothing will get executed.  This requires
	// the zcREAD_SPD command to be followed by 8 NOPs in order to guarantee
	// execution.

	zvgEcpPutc( zcREAD_SPD);				// setup to read monitor information
	zvgEcpPutc( zcNOP);						// must fill enough of buffer to allow
	zvgEcpPutc( zcNOP);						// READ_MON to execute
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);

	// wait for command to execute

	err = zvgIsDataAvail( 1000);			// wait for a second for data to show up

	if (err)
		return (err);

	// read 4 speed table bytes into buffer

	err = zvgGetMem( ZvgIO.mBfr, 4, &readLen);

	if (err)
		return( err);

	if (!err && (readLen != 4))
		err = errEcpBadData;

	// move the buffered speeds to the speed array

	speeds[0] = (uint)ZvgIO.mBfr[0];
	speeds[1] = (uint)ZvgIO.mBfr[1];
	speeds[2] = (uint)ZvgIO.mBfr[2];
	speeds[3] = (uint)ZvgIO.mBfr[3];

	// return to ECP mode

	ecpErr = zvgSetEcpMode();

	if (ecpErr)
		err = ecpErr;							// an ECP error has higher priority than a bad data error

	return (err);
}